

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O1

void __thiscall bitio::bitio_stream::seek(bitio_stream *this,int64_t n)

{
  byte bVar1;
  ulong uVar2;
  size_t sVar3;
  char cVar4;
  uchar uVar5;
  uint uVar6;
  bool bVar7;
  
  if (n != 0) {
    if (0 < n) {
      skip(this,n);
      return;
    }
    uVar6 = (uint)-n & 7;
    fseek((FILE *)this->file,(~((ulong)-n >> 3) + this->byte_index) - this->current_buffer_length,1)
    ;
    uVar2 = fread(this->byte_buffer,1,this->buffer_size,(FILE *)this->file);
    bVar7 = uVar2 == 0;
    if (bVar7) {
      uVar2 = this->current_buffer_length;
    }
    this->current_buffer_length = uVar2;
    this->eof = bVar7;
    this->byte_index = 1;
    bVar1 = this->bit_count;
    cVar4 = (char)uVar6;
    if ((long)(8 - (ulong)bVar1) < (long)(ulong)uVar6) {
      this->byte_index = 0;
      this->bit_buffer = *this->byte_buffer << (8 - bVar1 & 0x1f);
      fseek((FILE *)this->file,~uVar2,1);
      sVar3 = fread(this->byte_buffer,1,this->buffer_size,(FILE *)this->file);
      bVar7 = sVar3 == 0;
      if (bVar7) {
        sVar3 = this->current_buffer_length;
      }
      this->current_buffer_length = sVar3;
      this->eof = bVar7;
      this->byte_index = 1;
      this->bit_buffer = *this->byte_buffer << (8 - this->bit_count & 0x1f);
      lim_skip(this,'\b' - cVar4);
      return;
    }
    uVar5 = cVar4 + bVar1;
    this->bit_count = uVar5;
    this->bit_buffer = *this->byte_buffer << (8 - uVar5 & 0x1f);
  }
  return;
}

Assistant:

void bitio_stream::seek(int64_t n) {
    if (n == 0) return;
    if (n > 0) {
        skip(n);
    } else {

        auto nbits = -n;
        auto nbytes = nbits >> 0x3;
        auto rbits = nbits & 0x7;

        int64_t al_offset = (int64_t) byte_index - (int64_t) nbytes - 1 - (int64_t) current_buffer_length;

        fseek(file, al_offset, SEEK_CUR);

        load_buffer();
        byte_index++;

        if (rbits <= 8 - bit_count) {
            bit_count += rbits;
            bit_buffer = byte_buffer[byte_index - 1];
            bit_buffer <<= 8 - bit_count;
        } else {
            bit_buffer = byte_buffer[--byte_index];
            bit_buffer <<= 8 - bit_count;

            if (byte_index == 0) {
                fseek(file, -1-(int64_t) current_buffer_length, SEEK_CUR);
                load_buffer();
                bit_buffer = byte_buffer[byte_index++];
                bit_buffer <<= 8 - bit_count;
            }

            lim_skip(8 - rbits);
        }

    }
}